

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O0

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r2;
  float *r1;
  float *r0;
  float *img0;
  float *outptr;
  float *kernel0;
  float bias0;
  Mat out;
  int g;
  float *bias;
  float *kernel;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  float *in_stack_fffffffffffffec0;
  int c;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  int local_130;
  int local_12c;
  float *local_110;
  float *local_108;
  float *local_100;
  Mat local_e8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float local_94;
  Mat local_90;
  int local_54;
  float *local_50;
  float *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x24);
  local_30 = *(int *)(in_RSI + 0x24);
  local_34 = *(int *)(in_RSI + 0x28);
  local_38 = *(int *)(in_RDI + 0x2c);
  local_3c = local_2c * 2 + local_30 * -2;
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; c = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20), local_54 < local_38;
      local_54 = local_54 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),c);
    if (local_50 == (float *)0x0) {
      in_stack_fffffffffffffec8 = 0.0;
    }
    else {
      in_stack_fffffffffffffec8 = local_50[local_54];
    }
    local_a0 = local_48 + local_54 * 9;
    local_94 = in_stack_fffffffffffffec8;
    local_a8 = Mat::operator_cast_to_float_(&local_90);
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),c);
    in_stack_fffffffffffffec0 = Mat::operator_cast_to_float_(&local_e8);
    Mat::~Mat((Mat *)0x14653a);
    local_108 = in_stack_fffffffffffffec0 + local_2c;
    local_110 = in_stack_fffffffffffffec0 + (local_2c << 1);
    local_100 = in_stack_fffffffffffffec0;
    for (local_12c = 0; local_12c < local_34; local_12c = local_12c + 1) {
      for (local_130 = local_30; 0 < local_130; local_130 = local_130 + -1) {
        in_stack_fffffffffffffecc =
             local_110[2] * local_a0[8] +
             local_110[1] * local_a0[7] +
             *local_110 * local_a0[6] +
             local_108[2] * local_a0[5] +
             local_108[1] * local_a0[4] +
             *local_108 * local_a0[3] +
             local_100[2] * local_a0[2] +
             local_100[1] * local_a0[1] + *local_100 * *local_a0 + local_94;
        *local_a8 = in_stack_fffffffffffffecc;
        local_100 = local_100 + 2;
        local_108 = local_108 + 2;
        local_110 = local_110 + 2;
        local_a8 = local_a8 + 1;
      }
      local_100 = local_100 + local_3c;
      local_108 = local_108 + local_3c;
      local_110 = local_110 + local_3c;
    }
    local_b0 = in_stack_fffffffffffffec0;
    Mat::~Mat((Mat *)0x146805);
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g=0; g<group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g*9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w*2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain>0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }

    }
}